

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderLibraryCase.cpp
# Opt level: O3

string * __thiscall
deqp::sl::ShaderCase::genFragmentShader_abi_cxx11_
          (string *__return_storage_ptr__,ShaderCase *this,ValueBlock *valueBlock)

{
  GLSLVersion version;
  string *psVar1;
  DataType DVar2;
  char *pcVar3;
  size_t sVar4;
  ostream *poVar5;
  undefined4 uVar6;
  undefined8 unaff_RBP;
  long lVar7;
  char *in_R8;
  pointer pVVar8;
  char *pcVar9;
  long lVar10;
  ostringstream shader;
  ValueBlock *local_1d8;
  long local_1d0;
  undefined4 local_1c4;
  string *local_1c0;
  char *local_1b8;
  char *local_1b0;
  undefined1 local_1a8 [376];
  
  local_1d8 = valueBlock;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  version = this->m_targetVersion;
  if ((version < GLSL_VERSION_330) && ((0x71U >> (version & 0x1f) & 1) != 0)) {
    pcVar9 = "varying";
    uVar6 = 0;
  }
  else {
    pcVar9 = "in";
    uVar6 = (undefined4)CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
  }
  pcVar3 = glu::getGLSLVersionDeclaration(version);
  if (pcVar3 == (char *)0x0) {
    std::ios::clear((int)&local_1d8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) + 0x30);
  }
  else {
    sVar4 = strlen(pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar3,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"precision mediump float;\n",0x19);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"precision mediump int;\n",0x17);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  if ((char)uVar6 != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"layout(location = 0) out mediump vec4 dEQP_FragColor;\n",0x36);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  }
  genCompareFunctions((sl *)local_1a8,
                      (ostringstream *)
                      (local_1d8->values).
                      super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ValueBlock *)
                      (local_1d8->values).
                      super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
                      ._M_impl.super__Vector_impl_data._M_finish,true);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  pVVar8 = (local_1d8->values).
           super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_1c4 = uVar6;
  local_1c0 = __return_storage_ptr__;
  local_1b8 = pcVar9;
  if (0 < (int)((ulong)((long)(local_1d8->values).
                              super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar8) >> 3) *
          0x38e38e39) {
    lVar10 = 0x28;
    lVar7 = 0;
    do {
      local_1d0 = lVar7;
      DVar2 = glu::getDataTypeFloatScalars(*(DataType *)((long)&pVVar8->storageType + lVar10));
      pcVar9 = glu::getDataTypeName(DVar2);
      local_1b0 = glu::getDataTypeName(*(DataType *)((long)&pVVar8->storageType + lVar10));
      lVar7 = local_1d0;
      if (*(int *)((long)pVVar8 + lVar10 + -0x28) == 2) {
        DVar2 = glu::getDataTypeScalarType(*(DataType *)((long)&pVVar8->storageType + lVar10));
        pcVar3 = local_1b8;
        sVar4 = strlen(local_1b8);
        if (DVar2 == TYPE_FLOAT) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar3,sVar4);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
          if (pcVar9 == (char *)0x0) {
            lVar7 = 1;
            std::ios::clear((int)&local_1d8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) + 0x30);
            pcVar9 = " ";
          }
          else {
            sVar4 = strlen(pcVar9);
            lVar7 = 1;
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar9,sVar4);
            pcVar9 = " ";
          }
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar3,sVar4);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
          if (pcVar9 == (char *)0x0) {
            lVar7 = 3;
            std::ios::clear((int)&local_1d8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) + 0x30);
            pcVar9 = " v_";
          }
          else {
            sVar4 = strlen(pcVar9);
            lVar7 = 3;
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar9,sVar4);
            pcVar9 = " v_";
          }
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar9,lVar7);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,*(char **)((long)pVVar8 + lVar10 + -0x20),
                            *(long *)((long)pVVar8 + lVar10 + -0x18));
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,";\n",2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"uniform ",8);
        pcVar9 = local_1b0;
        if (local_1b0 == (char *)0x0) {
          std::ios::clear((int)&local_1d8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) + 0x30);
        }
        else {
          sVar4 = strlen(local_1b0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar9,sVar4);
        }
        lVar7 = local_1d0;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ref_",5);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,*(char **)((long)pVVar8 + lVar10 + -0x20),
                            *(long *)((long)pVVar8 + lVar10 + -0x18));
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,";\n",2);
      }
      lVar7 = lVar7 + 1;
      pVVar8 = (local_1d8->values).
               super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar10 = lVar10 + 0x48;
    } while (lVar7 < (int)((ulong)((long)(local_1d8->values).
                                         super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar8)
                          >> 3) * 0x38e38e39);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  psVar1 = local_1c0;
  uVar6 = local_1c4;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"void main()\n",0xc);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
  pcVar9 = "gl_FragColor";
  if ((char)uVar6 != '\0') {
    pcVar9 = "dEQP_FragColor";
  }
  genCompareOp((ostringstream *)local_1a8,pcVar9,local_1d8,"v_",in_R8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return psVar1;
}

Assistant:

string ShaderCase::genFragmentShader(const ValueBlock& valueBlock)
{
	ostringstream shader;
	const bool	usesInout		 = usesShaderInoutQualifiers(m_targetVersion);
	const bool	customColorOut = usesInout;
	const char*   fragIn		 = usesInout ? "in" : "varying";

	shader << glu::getGLSLVersionDeclaration(m_targetVersion) << "\n";

	shader << "precision mediump float;\n";
	shader << "precision mediump int;\n";
	shader << "\n";

	if (customColorOut)
	{
		shader << "layout(location = 0) out mediump vec4 dEQP_FragColor;\n";
		shader << "\n";
	}

	genCompareFunctions(shader, valueBlock, true);
	shader << "\n";

	// Declarations (varying, reference for each output).
	for (int ndx = 0; ndx < (int)valueBlock.values.size(); ndx++)
	{
		const ShaderCase::Value& val		  = valueBlock.values[ndx];
		DataType				 floatType	= getDataTypeFloatScalars(val.dataType);
		const char*				 floatTypeStr = getDataTypeName(floatType);
		const char*				 refTypeStr   = getDataTypeName(val.dataType);

		if (val.storageType == ShaderCase::Value::STORAGE_OUTPUT)
		{
			if (getDataTypeScalarType(val.dataType) == TYPE_FLOAT)
				shader << fragIn << " " << floatTypeStr << " " << val.valueName << ";\n";
			else
				shader << fragIn << " " << floatTypeStr << " v_" << val.valueName << ";\n";

			shader << "uniform " << refTypeStr << " ref_" << val.valueName << ";\n";
		}
	}

	shader << "\n";
	shader << "void main()\n";
	shader << "{\n";

	shader << " ";
	genCompareOp(shader, customColorOut ? "dEQP_FragColor" : "gl_FragColor", valueBlock, "v_", DE_NULL);

	shader << "}\n";
	return shader.str();
}